

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
interfaces::MakeWalletLoader(Chain *chain,ArgsManager *args)

{
  long lVar1;
  _Head_base<0UL,_interfaces::WalletLoader_*,_false> in_RDI;
  long in_FS_OFFSET;
  _Head_base<0UL,_interfaces::WalletLoader_*,_false> this;
  Chain *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this._M_head_impl = in_RDI._M_head_impl;
  std::make_unique<wallet::(anonymous_namespace)::WalletLoaderImpl,interfaces::Chain&,ArgsManager&>
            (in_stack_fffffffffffffff0,(ArgsManager *)in_RDI._M_head_impl);
  std::unique_ptr<interfaces::WalletLoader,std::default_delete<interfaces::WalletLoader>>::
  unique_ptr<wallet::(anonymous_namespace)::WalletLoaderImpl,std::default_delete<wallet::(anonymous_namespace)::WalletLoaderImpl>,void>
            ((unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_> *
             )this._M_head_impl,
             (unique_ptr<wallet::(anonymous_namespace)::WalletLoaderImpl,_std::default_delete<wallet::(anonymous_namespace)::WalletLoaderImpl>_>
              *)in_RDI._M_head_impl);
  ::wallet::_GLOBAL__N_1::std::
  unique_ptr<wallet::(anonymous_namespace)::WalletLoaderImpl,_std::default_delete<wallet::(anonymous_namespace)::WalletLoaderImpl>_>
  ::~unique_ptr((unique_ptr<wallet::(anonymous_namespace)::WalletLoaderImpl,_std::default_delete<wallet::(anonymous_namespace)::WalletLoaderImpl>_>
                 *)this._M_head_impl);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>,_true,_true>
            )(tuple<interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>)
             in_RDI._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<WalletLoader> MakeWalletLoader(Chain& chain, ArgsManager& args)
{
    return std::make_unique<wallet::WalletLoaderImpl>(chain, args);
}